

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

JSON __thiscall JSON::parse(JSON *this,string *s)

{
  void *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  void *pvVar2;
  JSON JVar3;
  BufferInputSource bis;
  JSONParser jp;
  BufferInputSource local_41c0;
  string local_40d8 [512];
  undefined8 local_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 uStack_a8;
  undefined7 uStack_a7;
  undefined1 uStack_a0;
  undefined8 uStack_9f;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 local_70;
  undefined4 local_68;
  void *local_60;
  void *pvStack_58;
  long local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 local_28;
  
  local_40d8[0]._M_dataplus._M_p = (pointer)&local_40d8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40d8,"json input","");
  BufferInputSource::BufferInputSource(&local_41c0,local_40d8,s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40d8[0]._M_dataplus._M_p != &local_40d8[0].field_2) {
    operator_delete(local_40d8[0]._M_dataplus._M_p,
                    CONCAT44(local_40d8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_40d8[0].field_2._M_allocated_capacity) + 1);
  }
  local_b8 = (undefined1 *)((long)&local_40d8[0].field_2 + 4);
  local_40d8[0]._M_string_length = 0;
  local_40d8[0].field_2._M_allocated_capacity._0_4_ = 0;
  local_c0 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  uStack_a7 = 0;
  uStack_a0 = 0;
  uStack_9f = 0;
  local_88 = 0;
  local_80 = 0;
  local_70 = 0;
  local_68 = 0;
  local_60 = (void *)0x0;
  pvStack_58 = (void *)0x0;
  local_50 = 0;
  local_40 = 0;
  local_38 = 0;
  local_28 = 0;
  local_40d8[0]._M_dataplus._M_p = (pointer)&local_41c0;
  local_90 = &local_80;
  local_48 = &local_38;
  anon_unknown.dwarf_461af::JSONParser::parse((JSONParser *)this);
  pvVar2 = local_60;
  pvVar1 = pvStack_58;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    pvVar2 = local_60;
    pvVar1 = pvStack_58;
  }
  for (; pvVar2 != pvVar1; pvVar2 = (void *)((long)pvVar2 + 0x18)) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar2 + 0x10) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar2 + 0x10));
    }
  }
  if (local_60 != (void *)0x0) {
    operator_delete(local_60,local_50 - (long)local_60);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  BufferInputSource::~BufferInputSource(&local_41c0);
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::parse(std::string const& s)
{
    BufferInputSource bis("json input", s);
    JSONParser jp(bis, nullptr);
    return jp.parse();
}